

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::RowObjPS::execute
          (RowObjPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *param_4,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  pointer pdVar3;
  VarStatus *pVVar4;
  VarStatus VVar5;
  
  iVar1 = this->m_i;
  pdVar3 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->m_j;
  pdVar3[iVar1] =
       pdVar3[iVar1] -
       (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[iVar2];
  if (rStatus->data[iVar1] != BASIC) {
    pVVar4 = cStatus->data;
    VVar5 = pVVar4[iVar2];
    if (VVar5 == ON_UPPER) {
      VVar5 = ON_LOWER;
    }
    else if (VVar5 == ON_LOWER) {
      VVar5 = ON_UPPER;
    }
    rStatus->data[iVar1] = VVar5;
    pVVar4[iVar2] = ZERO;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowObjPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
                                     VectorBase<R>&,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
                                     DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   s[m_i] = s[m_i] - x[m_j];

   assert(rStatus[m_i] != SPxSolverBase<R>::UNDEFINED);
   assert(cStatus[m_j] != SPxSolverBase<R>::UNDEFINED);
   assert(rStatus[m_i] != SPxSolverBase<R>::BASIC || cStatus[m_j] != SPxSolverBase<R>::BASIC);

   SPxOut::debug(this, "RowObjPS: removing slack column {} ({}) for row {} ({}).\n", m_j, cStatus[m_j],
                 m_i, rStatus[m_i]);

   if(rStatus[m_i] != SPxSolverBase<R>::BASIC)
   {
      switch(cStatus[m_j])
      {
      case SPxSolverBase<R>::ON_UPPER:
         rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
         break;

      case SPxSolverBase<R>::ON_LOWER:
         rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;
         break;

      default:
         rStatus[m_i] = cStatus[m_j];
      }

      // otherwise checkBasisDim() may fail
      cStatus[m_j] = SPxSolverBase<R>::ZERO;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      assert(false);
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}